

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O3

FileInfo *
llbuild::basic::FileInfo::getInfoForPath(FileInfo *__return_storage_ptr__,string *path,bool asLink)

{
  char *__file;
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000011;
  StatStruct buf;
  stat local_98;
  
  (__return_storage_ptr__->checksum).bytes[0x10] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x11] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x12] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x13] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x14] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x15] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x16] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x17] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x18] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x19] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x1a] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x1b] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x1c] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x1d] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x1e] = '\0';
  (__return_storage_ptr__->checksum).bytes[0x1f] = '\0';
  (__return_storage_ptr__->checksum).bytes[0] = '\0';
  (__return_storage_ptr__->checksum).bytes[1] = '\0';
  (__return_storage_ptr__->checksum).bytes[2] = '\0';
  (__return_storage_ptr__->checksum).bytes[3] = '\0';
  (__return_storage_ptr__->checksum).bytes[4] = '\0';
  (__return_storage_ptr__->checksum).bytes[5] = '\0';
  (__return_storage_ptr__->checksum).bytes[6] = '\0';
  (__return_storage_ptr__->checksum).bytes[7] = '\0';
  (__return_storage_ptr__->checksum).bytes[8] = '\0';
  (__return_storage_ptr__->checksum).bytes[9] = '\0';
  (__return_storage_ptr__->checksum).bytes[10] = '\0';
  (__return_storage_ptr__->checksum).bytes[0xb] = '\0';
  (__return_storage_ptr__->checksum).bytes[0xc] = '\0';
  (__return_storage_ptr__->checksum).bytes[0xd] = '\0';
  (__return_storage_ptr__->checksum).bytes[0xe] = '\0';
  (__return_storage_ptr__->checksum).bytes[0xf] = '\0';
  __file = (path->_M_dataplus)._M_p;
  if ((int)CONCAT71(in_register_00000011,asLink) == 0) {
    iVar2 = sys::stat(__file,&local_98);
  }
  else {
    iVar2 = sys::lstat(__file,&local_98);
  }
  if (iVar2 == 0) {
    __return_storage_ptr__->device = local_98.st_dev;
    __return_storage_ptr__->inode = local_98.st_ino;
    __return_storage_ptr__->mode = (ulong)local_98.st_mode;
    __return_storage_ptr__->size = local_98.st_size;
    (__return_storage_ptr__->modTime).seconds = local_98.st_mtim.tv_sec;
    (__return_storage_ptr__->modTime).nanoseconds = local_98.st_mtim.tv_nsec;
    bVar1 = isMissing(__return_storage_ptr__);
    if (bVar1) {
      (__return_storage_ptr__->modTime).nanoseconds = 1;
      bVar1 = isMissing(__return_storage_ptr__);
      if (bVar1) {
        __assert_fail("!result.isMissing()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/FileInfo.cpp"
                      ,0x40,
                      "static FileInfo llbuild::basic::FileInfo::getInfoForPath(const std::string &, bool)"
                     );
      }
    }
  }
  else {
    (__return_storage_ptr__->checksum).bytes[0x10] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x11] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x12] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x13] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x14] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x15] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x16] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x17] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x18] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x19] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1a] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1b] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1c] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1d] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1e] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1f] = '\0';
    (__return_storage_ptr__->checksum).bytes[0] = '\0';
    (__return_storage_ptr__->checksum).bytes[1] = '\0';
    (__return_storage_ptr__->checksum).bytes[2] = '\0';
    (__return_storage_ptr__->checksum).bytes[3] = '\0';
    (__return_storage_ptr__->checksum).bytes[4] = '\0';
    (__return_storage_ptr__->checksum).bytes[5] = '\0';
    (__return_storage_ptr__->checksum).bytes[6] = '\0';
    (__return_storage_ptr__->checksum).bytes[7] = '\0';
    (__return_storage_ptr__->checksum).bytes[8] = '\0';
    (__return_storage_ptr__->checksum).bytes[9] = '\0';
    (__return_storage_ptr__->checksum).bytes[10] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xb] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xc] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xd] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xe] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xf] = '\0';
    (__return_storage_ptr__->modTime).seconds = 0;
    (__return_storage_ptr__->modTime).nanoseconds = 0;
    __return_storage_ptr__->mode = 0;
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->device = 0;
    __return_storage_ptr__->inode = 0;
    bVar1 = isMissing(__return_storage_ptr__);
    if (!bVar1) {
      __assert_fail("result.isMissing()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/FileInfo.cpp"
                    ,0x28,
                    "static FileInfo llbuild::basic::FileInfo::getInfoForPath(const std::string &, bool)"
                   );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FileInfo FileInfo::getInfoForPath(const std::string& path, bool asLink) {
  FileInfo result;

  sys::StatStruct buf;
  auto statResult =
    asLink ? sys::lstat(path.c_str(), &buf) : sys::stat(path.c_str(), &buf);
  if (statResult != 0) {
    memset(&result, 0, sizeof(result));
    assert(result.isMissing());
    return result;
  }

  result.device = buf.st_dev;
  result.inode = buf.st_ino;
  result.mode = buf.st_mode;
  result.size = buf.st_size;
#if defined(__APPLE__)
  auto seconds = buf.st_mtimespec.tv_sec;
  auto nanoseconds = buf.st_mtimespec.tv_nsec;
#elif defined(_WIN32)
  auto seconds = buf.st_mtime;
  auto nanoseconds = 0;
#else
  auto seconds = buf.st_mtim.tv_sec;
  auto nanoseconds = buf.st_mtim.tv_nsec;
#endif
  result.modTime.seconds = seconds;
  result.modTime.nanoseconds = nanoseconds;

  // Enforce we never accidentally create our sentinel missing file value.
  if (result.isMissing()) {
    result.modTime.nanoseconds = 1;
    assert(!result.isMissing());
  }

  return result;
}